

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locmap.cpp
# Opt level: O0

uint32_t getHostID(ILcidPosixMap *this_0,char *posixID,UErrorCode *status)

{
  uint32_t uVar1;
  size_t sVar2;
  uint local_38;
  int32_t sameChars;
  uint32_t idx;
  int32_t posixIDlen;
  int32_t bestIdxDiff;
  int32_t bestIdx;
  UErrorCode *status_local;
  char *posixID_local;
  ILcidPosixMap *this_0_local;
  
  posixIDlen = 0;
  idx = 0;
  sVar2 = strlen(posixID);
  local_38 = 0;
  do {
    if (this_0->numRegions <= local_38) {
      if (((posixID[(int)idx] == '_') || (posixID[(int)idx] == '@')) &&
         (this_0->regionMaps[posixIDlen].posixID[(int)idx] == '\0')) {
        *status = U_ERROR_WARNING_START;
        this_0_local._4_4_ = this_0->regionMaps[posixIDlen].hostID;
      }
      else {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        this_0_local._4_4_ = this_0->regionMaps->hostID;
      }
      return this_0_local._4_4_;
    }
    uVar1 = idCmp(posixID,this_0->regionMaps[local_38].posixID);
    if (((int)idx < (int)uVar1) && (this_0->regionMaps[local_38].posixID[(int)uVar1] == '\0')) {
      if ((uint32_t)sVar2 == uVar1) {
        return this_0->regionMaps[local_38].hostID;
      }
      posixIDlen = local_38;
      idx = uVar1;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

static uint32_t
getHostID(const ILcidPosixMap *this_0, const char* posixID, UErrorCode* status)
{
    int32_t bestIdx = 0;
    int32_t bestIdxDiff = 0;
    int32_t posixIDlen = (int32_t)uprv_strlen(posixID);
    uint32_t idx;

    for (idx = 0; idx < this_0->numRegions; idx++ ) {
        int32_t sameChars = idCmp(posixID, this_0->regionMaps[idx].posixID);
        if (sameChars > bestIdxDiff && this_0->regionMaps[idx].posixID[sameChars] == 0) {
            if (posixIDlen == sameChars) {
                /* Exact match */
                return this_0->regionMaps[idx].hostID;
            }
            bestIdxDiff = sameChars;
            bestIdx = idx;
        }
    }
    /* We asked for something unusual, like en_ZZ, and we try to return the number for the same language. */
    /* We also have to make sure that sid and si and similar string subsets don't match. */
    if ((posixID[bestIdxDiff] == '_' || posixID[bestIdxDiff] == '@')
        && this_0->regionMaps[bestIdx].posixID[bestIdxDiff] == 0)
    {
        *status = U_USING_FALLBACK_WARNING;
        return this_0->regionMaps[bestIdx].hostID;
    }

    /*no match found */
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return this_0->regionMaps->hostID;
}